

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

uint add_list_to_class(uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,
                      compile_block_16 *cb,uint32_t *p,uint except)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar2 = *p;
  if (uVar2 != 0xffffffff) {
    do {
      iVar3 = 1;
      uVar1 = 1;
      uVar5 = uVar2;
      do {
        uVar4 = uVar1;
        iVar3 = iVar3 + -1;
        uVar5 = uVar5 + 1;
        uVar1 = uVar4 + 1;
      } while (uVar5 == p[uVar4]);
      cb->class_range_start = uVar2;
      cb->class_range_end = p[(uint)-iVar3];
      add_to_class_internal(classbits,uchardptr,options,cb,*p,p[(uint)-iVar3]);
      uVar2 = p[uVar4];
      p = p + uVar4;
    } while (uVar2 != 0xffffffff);
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static unsigned int
add_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr, uint32_t options,
  compile_block *cb, const uint32_t *p, unsigned int except)
{
unsigned int n8 = 0;
while (p[0] < NOTACHAR)
  {
  unsigned int n = 0;
  if (p[0] != except)
    {
    while(p[n+1] == p[0] + n + 1) n++;
    cb->class_range_start = p[0];
    cb->class_range_end = p[n];
    n8 += add_to_class_internal(classbits, uchardptr, options, cb, p[0], p[n]);
    }
  p += n + 1;
  }
return n8;
}